

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poly1305_vec.cc
# Opt level: O0

void CRYPTO_poly1305_finish(poly1305_state *state,uint8_t *mac)

{
  undefined1 a [16];
  undefined1 a_00 [16];
  undefined1 a_01 [16];
  undefined1 a_02 [16];
  undefined1 a_03 [16];
  undefined1 a_04 [16];
  undefined1 a_05 [16];
  undefined1 v [16];
  undefined1 a_06 [16];
  undefined1 a_07 [16];
  undefined1 v_00 [16];
  undefined1 a_08 [16];
  undefined1 a_09 [16];
  undefined1 v_01 [16];
  undefined1 b [16];
  undefined1 b_00 [16];
  undefined1 b_01 [16];
  undefined1 b_02 [16];
  undefined1 b_03 [16];
  undefined1 b_04 [16];
  poly1305_state_internal *st_00;
  size_t sVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t a_10;
  uint64_t a_11;
  uint128_t *__return_storage_ptr__;
  uint128_t *puVar4;
  uint128_t *puVar5;
  uint128_t *puVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong lo;
  uint64_t extraout_RDX;
  uint64_t b_05;
  uint64_t b_06;
  uint64_t b_07;
  uint64_t b_08;
  uint64_t b_09;
  uint64_t b_10;
  uint64_t b_11;
  uint64_t b_12;
  uint64_t b_13;
  uint64_t extraout_RDX_00;
  uint64_t in_stack_fffffffffffffc58;
  uint128_t *in_stack_fffffffffffffc60;
  size_t consumed;
  poly1305_power *p;
  uint64_t s2;
  uint64_t s1;
  uint64_t r2;
  uint64_t r1;
  uint64_t r0;
  uint64_t nc;
  uint64_t c;
  uint64_t g2;
  uint64_t g1;
  uint64_t g0;
  uint64_t t1;
  uint64_t t0;
  uint64_t h2;
  uint64_t h1;
  uint64_t h0;
  uint128_t d [3];
  uint8_t *local_30;
  uint8_t *m;
  size_t leftover;
  poly1305_state_internal *st;
  uint8_t *mac_local;
  poly1305_state *state_local;
  
  st_00 = poly1305_aligned_state(state);
  m = (uint8_t *)st_00->leftover;
  local_30 = st_00->buffer;
  if (st_00->started != 0) {
    sVar1 = poly1305_combine(st_00,local_30,(size_t)m);
    m = m + -sVar1;
    local_30 = local_30 + sVar1;
  }
  h1 = (st_00->field_1).HH[0];
  h2 = (st_00->field_1).HH[1];
  t0 = (st_00->field_1).HH[2];
  uVar2 = CONCAT44(st_00->P[1].R20.d[3],st_00->P[1].R20.d[1]);
  uVar3 = CONCAT44(st_00->P[1].R21.d[3],st_00->P[1].R21.d[1]);
  a_10 = CONCAT44(st_00->P[1].R22.d[3],st_00->P[1].R22.d[1]);
  a_11 = a_10 * 0x14;
  if (m < (uint8_t *)0x10) goto LAB_0074d286;
  do {
    uVar8 = CRYPTO_load_u64_le(local_30);
    uVar9 = CRYPTO_load_u64_le(local_30 + 8);
    h1 = (uVar8 & 0xfffffffffff) + h1;
    uVar8 = shr128_pair(uVar9,uVar8,0x2c);
    h2 = (uVar8 & 0xfffffffffff) + h2;
    t0 = (uVar9 >> 0x18 | 0x10000000000) + t0;
    uVar8 = extraout_RDX;
    while( true ) {
      __return_storage_ptr__ = mul64x64_128((uint128_t *)h1,uVar2,uVar8);
      uVar8 = b_05;
      mul64x64_128((uint128_t *)h2,a_11,b_05);
      a._8_8_ = __return_storage_ptr__;
      a._0_8_ = uVar8;
      b._8_8_ = in_stack_fffffffffffffc60;
      b._0_8_ = in_stack_fffffffffffffc58;
      in_stack_fffffffffffffc60 = add128(__return_storage_ptr__,(uint128_t)a,(uint128_t)b);
      in_stack_fffffffffffffc58 = b_06;
      mul64x64_128((uint128_t *)t0,uVar3 * 0x14,b_06);
      a_00._8_8_ = __return_storage_ptr__;
      a_00._0_8_ = uVar8;
      b_00._8_8_ = in_stack_fffffffffffffc60;
      b_00._0_8_ = in_stack_fffffffffffffc58;
      puVar4 = add128(in_stack_fffffffffffffc60,(uint128_t)a_00,(uint128_t)b_00);
      puVar5 = mul64x64_128((uint128_t *)h1,uVar3,b_07);
      mul64x64_128((uint128_t *)h2,uVar2,b_08);
      a_01._8_8_ = __return_storage_ptr__;
      a_01._0_8_ = uVar8;
      b_01._8_8_ = in_stack_fffffffffffffc60;
      b_01._0_8_ = in_stack_fffffffffffffc58;
      puVar5 = add128(puVar5,(uint128_t)a_01,(uint128_t)b_01);
      mul64x64_128((uint128_t *)t0,a_11,b_09);
      a_02._8_8_ = __return_storage_ptr__;
      a_02._0_8_ = uVar8;
      b_02._8_8_ = in_stack_fffffffffffffc60;
      b_02._0_8_ = in_stack_fffffffffffffc58;
      puVar5 = add128(puVar5,(uint128_t)a_02,(uint128_t)b_02);
      puVar6 = mul64x64_128((uint128_t *)h1,a_10,b_10);
      mul64x64_128((uint128_t *)h2,uVar3,b_11);
      a_03._8_8_ = __return_storage_ptr__;
      a_03._0_8_ = uVar8;
      b_03._8_8_ = in_stack_fffffffffffffc60;
      b_03._0_8_ = in_stack_fffffffffffffc58;
      puVar6 = add128(puVar6,(uint128_t)a_03,(uint128_t)b_03);
      mul64x64_128((uint128_t *)t0,uVar2,b_12);
      a_04._8_8_ = __return_storage_ptr__;
      a_04._0_8_ = uVar8;
      b_04._8_8_ = in_stack_fffffffffffffc60;
      b_04._0_8_ = in_stack_fffffffffffffc58;
      puVar6 = add128(puVar6,(uint128_t)a_04,(uint128_t)b_04);
      a_05._8_8_ = __return_storage_ptr__;
      a_05._0_8_ = uVar8;
      uVar9 = lo128((uint128_t)a_05);
      v._8_8_ = __return_storage_ptr__;
      v._0_8_ = uVar8;
      shr128((uint128_t)v,(int)puVar4);
      a_06._8_8_ = __return_storage_ptr__;
      a_06._0_8_ = uVar8;
      puVar4 = add128_64(puVar5,(uint128_t)a_06,b_10);
      a_07._8_8_ = __return_storage_ptr__;
      a_07._0_8_ = uVar8;
      uVar7 = lo128((uint128_t)a_07);
      h2 = uVar7 & 0xfffffffffff;
      v_00._8_8_ = __return_storage_ptr__;
      v_00._0_8_ = uVar8;
      shr128((uint128_t)v_00,(int)puVar4);
      a_08._8_8_ = __return_storage_ptr__;
      a_08._0_8_ = uVar8;
      puVar4 = add128_64(puVar6,(uint128_t)a_08,b_13);
      a_09._8_8_ = __return_storage_ptr__;
      a_09._0_8_ = uVar8;
      uVar7 = lo128((uint128_t)a_09);
      t0 = uVar7 & 0x3ffffffffff;
      v_01._8_8_ = __return_storage_ptr__;
      v_01._0_8_ = uVar8;
      uVar8 = shr128((uint128_t)v_01,(int)puVar4);
      h1 = uVar8 * 5 + (uVar9 & 0xfffffffffff);
      local_30 = local_30 + 0x10;
      m = m + -0x10;
      if ((uint8_t *)0xf < m) break;
LAB_0074d286:
      if (m == (uint8_t *)0x0) {
        uVar10 = (h1 >> 0x2c) + h2;
        uVar11 = uVar10 & 0xfffffffffff;
        uVar10 = (uVar10 >> 0x2c) + t0;
        uVar12 = uVar10 & 0x3ffffffffff;
        uVar10 = (uVar10 >> 0x2a) * 5 + (h1 & 0xfffffffffff);
        uVar13 = uVar10 + 5;
        uVar14 = uVar11 + (uVar13 >> 0x2c);
        uVar15 = (uVar12 + (uVar14 >> 0x2c)) - 0x40000000000;
        uVar16 = 0xffffffffffffffff - ((long)uVar15 >> 0x3f);
        uVar17 = uVar16 ^ 0xffffffffffffffff;
        lo = CONCAT44(st_00->P[1].R23.d[3],st_00->P[1].R23.d[1]);
        uVar2 = CONCAT44(st_00->P[1].R24.d[3],st_00->P[1].R24.d[1]);
        uVar10 = (lo & 0xfffffffffff) + (uVar10 & uVar17 | uVar13 & 0xfffffffffff & uVar16);
        uVar3 = shr128_pair(uVar2,lo,0x2c);
        uVar11 = (uVar3 & 0xfffffffffff) + (uVar10 >> 0x2c) +
                 (uVar11 & uVar17 | uVar14 & 0xfffffffffff & uVar16);
        uVar13 = uVar11 & 0xfffffffffff;
        CRYPTO_store_u64_le(mac,uVar10 & 0xfffffffffff | uVar13 << 0x2c);
        CRYPTO_store_u64_le(mac + 8,uVar13 >> 0x14 |
                                    ((uVar2 >> 0x18) + (uVar11 >> 0x2c) +
                                    (uVar12 & uVar17 | uVar15 & uVar16)) * 0x1000000);
        return;
      }
      local_30[(long)m] = '\x01';
      OPENSSL_memset(local_30 + (long)(m + 1),0,0x10 - (long)(m + 1));
      m = (uint8_t *)0x10;
      uVar8 = CRYPTO_load_u64_le(local_30);
      uVar9 = CRYPTO_load_u64_le(local_30 + 8);
      h1 = (uVar8 & 0xfffffffffff) + h1;
      uVar8 = shr128_pair(uVar9,uVar8,0x2c);
      h2 = (uVar8 & 0xfffffffffff) + h2;
      t0 = (uVar9 >> 0x18) + t0;
      uVar8 = extraout_RDX_00;
    }
  } while( true );
}

Assistant:

void CRYPTO_poly1305_finish(poly1305_state *state, uint8_t mac[16]) {
  poly1305_state_internal *st = poly1305_aligned_state(state);
  size_t leftover = st->leftover;
  uint8_t *m = st->buffer;
  uint128_t d[3];
  uint64_t h0, h1, h2;
  uint64_t t0, t1;
  uint64_t g0, g1, g2, c, nc;
  uint64_t r0, r1, r2, s1, s2;
  poly1305_power *p;

  if (st->started) {
    size_t consumed = poly1305_combine(st, m, leftover);
    leftover -= consumed;
    m += consumed;
  }

  // st->HH will either be 0 or have the combined result
  h0 = st->HH[0];
  h1 = st->HH[1];
  h2 = st->HH[2];

  p = &st->P[1];
  r0 = ((uint64_t)p->R20.d[3] << 32) | (uint64_t)p->R20.d[1];
  r1 = ((uint64_t)p->R21.d[3] << 32) | (uint64_t)p->R21.d[1];
  r2 = ((uint64_t)p->R22.d[3] << 32) | (uint64_t)p->R22.d[1];
  s1 = r1 * (5 << 2);
  s2 = r2 * (5 << 2);

  if (leftover < 16) {
    goto poly1305_donna_atmost15bytes;
  }

poly1305_donna_atleast16bytes:
  t0 = CRYPTO_load_u64_le(m + 0);
  t1 = CRYPTO_load_u64_le(m + 8);
  h0 += t0 & 0xfffffffffff;
  t0 = shr128_pair(t1, t0, 44);
  h1 += t0 & 0xfffffffffff;
  h2 += (t1 >> 24) | ((uint64_t)1 << 40);

poly1305_donna_mul:
  d[0] = add128(add128(mul64x64_128(h0, r0), mul64x64_128(h1, s2)),
                mul64x64_128(h2, s1));
  d[1] = add128(add128(mul64x64_128(h0, r1), mul64x64_128(h1, r0)),
                mul64x64_128(h2, s2));
  d[2] = add128(add128(mul64x64_128(h0, r2), mul64x64_128(h1, r1)),
                mul64x64_128(h2, r0));
  h0 = lo128(d[0]) & 0xfffffffffff;
  c = shr128(d[0], 44);
  d[1] = add128_64(d[1], c);
  h1 = lo128(d[1]) & 0xfffffffffff;
  c = shr128(d[1], 44);
  d[2] = add128_64(d[2], c);
  h2 = lo128(d[2]) & 0x3ffffffffff;
  c = shr128(d[2], 42);
  h0 += c * 5;

  m += 16;
  leftover -= 16;
  if (leftover >= 16) {
    goto poly1305_donna_atleast16bytes;
  }

// final bytes
poly1305_donna_atmost15bytes:
  if (!leftover) {
    goto poly1305_donna_finish;
  }

  m[leftover++] = 1;
  OPENSSL_memset(m + leftover, 0, 16 - leftover);
  leftover = 16;

  t0 = CRYPTO_load_u64_le(m + 0);
  t1 = CRYPTO_load_u64_le(m + 8);
  h0 += t0 & 0xfffffffffff;
  t0 = shr128_pair(t1, t0, 44);
  h1 += t0 & 0xfffffffffff;
  h2 += (t1 >> 24);

  goto poly1305_donna_mul;

poly1305_donna_finish:
  c = (h0 >> 44);
  h0 &= 0xfffffffffff;
  h1 += c;
  c = (h1 >> 44);
  h1 &= 0xfffffffffff;
  h2 += c;
  c = (h2 >> 42);
  h2 &= 0x3ffffffffff;
  h0 += c * 5;

  g0 = h0 + 5;
  c = (g0 >> 44);
  g0 &= 0xfffffffffff;
  g1 = h1 + c;
  c = (g1 >> 44);
  g1 &= 0xfffffffffff;
  g2 = h2 + c - ((uint64_t)1 << 42);

  c = (g2 >> 63) - 1;
  nc = ~c;
  h0 = (h0 & nc) | (g0 & c);
  h1 = (h1 & nc) | (g1 & c);
  h2 = (h2 & nc) | (g2 & c);

  // pad
  t0 = ((uint64_t)p->R23.d[3] << 32) | (uint64_t)p->R23.d[1];
  t1 = ((uint64_t)p->R24.d[3] << 32) | (uint64_t)p->R24.d[1];
  h0 += (t0 & 0xfffffffffff);
  c = (h0 >> 44);
  h0 &= 0xfffffffffff;
  t0 = shr128_pair(t1, t0, 44);
  h1 += (t0 & 0xfffffffffff) + c;
  c = (h1 >> 44);
  h1 &= 0xfffffffffff;
  t1 = (t1 >> 24);
  h2 += (t1) + c;

  CRYPTO_store_u64_le(mac + 0, ((h0) | (h1 << 44)));
  CRYPTO_store_u64_le(mac + 8, ((h1 >> 20) | (h2 << 24)));
}